

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

int GA_Pgroup_create(int *list,int count)

{
  Integer *list_00;
  ulong uVar1;
  Integer IVar2;
  ulong uVar3;
  
  list_00 = (Integer *)malloc((long)count * 8);
  uVar1 = 0;
  uVar3 = 0;
  if (0 < count) {
    uVar3 = (ulong)(uint)count;
  }
  for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
    list_00[uVar1] = (long)list[uVar1];
  }
  IVar2 = pnga_pgroup_create(list_00,(long)count);
  free(list_00);
  return (int)IVar2;
}

Assistant:

int GA_Pgroup_create(int *list, int count)
{
    Integer acount = (Integer)count;
    int i;
    int grp_id;
    Integer *_ga_map_capi;
    _ga_map_capi = (Integer*)malloc(count * sizeof(Integer));
    for (i=0; i<count; i++)
       _ga_map_capi[i] = (Integer)list[i];
    grp_id = (int)wnga_pgroup_create(_ga_map_capi,acount);
    free(_ga_map_capi);
    return grp_id;
}